

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

ecs_entity_t
ecs_lookup_path_w_sep(ecs_world_t *world,ecs_entity_t parent,char *path,char *sep,char *prefix)

{
  char *pcVar1;
  bool bVar2;
  ecs_entity_t eVar3;
  ecs_entity_t parent_00;
  char *path_00;
  char *sep_00;
  char buff [64];
  char *local_80;
  char local_78 [72];
  
  if (path == (char *)0x0) {
    eVar3 = 0;
  }
  else {
    local_80 = path;
    eVar3 = find_as_alias(world,path);
    if (eVar3 == 0) {
      sep_00 = ".";
      if (sep != (char *)0x0) {
        sep_00 = sep;
      }
      parent_00 = get_parent_from_path(world,parent,&local_80,prefix);
      pcVar1 = local_80;
      bVar2 = false;
      path_00 = pcVar1;
      eVar3 = parent_00;
LAB_001147b9:
      path_00 = path_elem(path_00,local_78,sep_00);
      if (path_00 != (char *)0x0) goto code_r0x001147cc;
      goto LAB_001147e8;
    }
  }
  return eVar3;
code_r0x001147cc:
  parent_00 = ecs_lookup_child(world,parent_00,local_78);
  if (parent_00 == 0) {
    parent_00 = 0;
LAB_001147e8:
    if (parent_00 != 0 || bVar2) {
      return parent_00;
    }
    if (eVar3 == 0) {
      bVar2 = true;
      parent_00 = 0x118;
      path_00 = pcVar1;
      eVar3 = parent_00;
    }
    else {
      parent_00 = ecs_get_parent_w_entity(world,eVar3,0);
      path_00 = pcVar1;
      eVar3 = parent_00;
    }
  }
  goto LAB_001147b9;
}

Assistant:

ecs_entity_t ecs_lookup_path_w_sep(
    ecs_world_t *world,
    ecs_entity_t parent,
    const char *path,
    const char *sep,
    const char *prefix)
{
    if (!path) {
        return 0;
    }

    ecs_entity_t e = find_as_alias(world, path);
    if (e) {
        return e;
    }      
    
    char buff[ECS_MAX_NAME_LENGTH];
    const char *ptr;
    ecs_entity_t cur;
    bool core_searched = false;

    if (!sep) {
        sep = ".";
    }

    parent = get_parent_from_path(world, parent, &path, prefix);

retry:
    cur = parent;
    ptr = path;

    while ((ptr = path_elem(ptr, buff, sep))) {
        cur = ecs_lookup_child(world, cur, buff);
        if (!cur) {
            goto tail;
        }
    }

tail:
    if (!cur) {
        if (!core_searched) {
            if (parent) {
                parent = ecs_get_parent_w_entity(world, parent, 0);
            } else {
                parent = EcsFlecsCore;
                core_searched = true;
            }
            goto retry;
        }
    }

    return cur;
}